

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *expected_predicate_value;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff878;
  int in_stack_fffffffffffff87c;
  pair<int,_int> in_stack_fffffffffffff880;
  pair<int,_int> in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8a0;
  undefined2 in_stack_fffffffffffff8a8;
  undefined1 in_stack_fffffffffffff8aa;
  undefined1 in_stack_fffffffffffff8ab;
  Type in_stack_fffffffffffff8ac;
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff8b0;
  char *actual_predicate_value;
  char *expression_text;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_00;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff900;
  AssertionResult local_6c8 [3];
  value_type local_690;
  value_type local_680;
  int local_674;
  pair<int,_int> local_648;
  int local_640;
  pair<int,_int> local_638;
  int local_630;
  int local_62c;
  string local_628 [55];
  undefined1 local_5f1;
  AssertionResult local_5f0 [3];
  value_type local_5b8;
  value_type local_5a8;
  string local_598 [55];
  byte local_561;
  AssertionResult local_560;
  string local_550 [55];
  undefined1 local_519;
  AssertionResult local_518 [3];
  value_type local_4e0;
  value_type local_4d0;
  string local_4c0 [55];
  byte local_489;
  AssertionResult local_488;
  string local_478 [55];
  undefined1 local_441;
  AssertionResult local_440;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_430 [9];
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> local_398 [2];
  string local_378 [55];
  undefined1 local_341;
  AssertionResult local_340;
  string local_330 [55];
  byte local_2f9;
  AssertionResult local_2f8;
  string local_2e8 [55];
  undefined1 local_2b1;
  AssertionResult local_2b0;
  key_type local_2a0;
  string local_298 [55];
  byte local_261;
  AssertionResult local_260;
  string local_250 [55];
  undefined1 local_219;
  AssertionResult local_218;
  string local_208 [55];
  byte local_1d1;
  AssertionResult local_1d0;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_178 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8;
  char local_a8 [12];
  char local_9c [156];
  
  actual_predicate_value = local_9c;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  expression_text = local_a8;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  expected_predicate_value = (char *)0x0;
  this_00 = &local_b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_00,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff8b0,
             CONCAT44(in_stack_fffffffffffff8ac,
                      CONCAT13(in_stack_fffffffffffff8ab,
                               CONCAT12(in_stack_fffffffffffff8aa,in_stack_fffffffffffff8a8))),
             (hasher *)in_stack_fffffffffffff8a0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
             (allocator_type *)in_stack_fffffffffffff890);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_178,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff8b0,
             CONCAT44(in_stack_fffffffffffff8ac,
                      CONCAT13(in_stack_fffffffffffff8ab,
                               CONCAT12(in_stack_fffffffffffff8aa,in_stack_fffffffffffff8a8))),
             (hasher *)in_stack_fffffffffffff8a0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
             (allocator_type *)in_stack_fffffffffffff890);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_178);
  local_189 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0df56)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_1c0);
    testing::Message::~Message((Message *)0xf0e09a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0e12e);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff880,
                       (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_1d1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0e16c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_208);
    testing::Message::~Message((Message *)0xf0e241);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0e2d5);
  local_219 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0e316)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_250);
    testing::Message::~Message((Message *)0xf0e3eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0e47f);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff880,
                       (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_261 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0e4c2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_298);
    testing::Message::~Message((Message *)0xf0e597);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0e62e);
  local_2a0 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                          in_stack_fffffffffffff890.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff880,
                    (key_type *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_2b1 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0e6a9)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_2e8);
    testing::Message::~Message((Message *)0xf0e77e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0e812);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff880,
                       (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_2f9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0e855)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_330);
    testing::Message::~Message((Message *)0xf0e92a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0e9be);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)in_stack_fffffffffffff880,
           CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_341 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0ea13)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_378);
    testing::Message::~Message((Message *)0xf0eae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0eb7f);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::Alloc(local_398,2,(int *)0x0);
  Alloc<int,unsigned_long,18446744073709551615ul>::Alloc<std::pair<int,int>>
            ((Alloc<int,unsigned_long,18446744073709551615ul> *)local_430,local_398);
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff8b0,
             CONCAT44(in_stack_fffffffffffff8ac,
                      CONCAT13(in_stack_fffffffffffff8ab,
                               CONCAT12(in_stack_fffffffffffff8aa,in_stack_fffffffffffff8a8))),
             (hasher *)in_stack_fffffffffffff8a0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
             (allocator_type *)in_stack_fffffffffffff890);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_430);
  local_441 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0ec37)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_478);
    testing::Message::~Message((Message *)0xf0ed64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0edf8);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff880,
                       (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_489 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0ee3b)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff8b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (char *)in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_4c0);
    testing::Message::~Message((Message *)0xf0ef10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0efa7);
  vVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  local_4e0 = vVar2;
  local_4d0 = vVar2;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff900,(value_type *)this_00);
  local_519 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator!=((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0f057)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_518);
  if (!bVar1) {
    testing::Message::Message((Message *)vVar2.first);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)vVar2.first,vVar2.second,(char *)in_stack_fffffffffffff8a0,
               in_stack_fffffffffffff89c,(char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_550);
    testing::Message::~Message((Message *)0xf0f12c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0f1c0);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff880,
                       (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  local_561 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0f203)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar1) {
    testing::Message::Message((Message *)vVar2.first);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)vVar2.first,vVar2.second,(char *)in_stack_fffffffffffff8a0,
               in_stack_fffffffffffff89c,(char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_598);
    testing::Message::~Message((Message *)0xf0f2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0f36f);
  vVar3 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject(in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c);
  local_5b8 = vVar3;
  local_5a8 = vVar3;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff900,(value_type *)this_00);
  local_5f1 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff880,
                           (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff880,
             (bool *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878),(type *)0xf0f41f)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f0);
  if (!bVar1) {
    testing::Message::Message((Message *)vVar2.first);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)vVar2.first,vVar2.second,(char *)vVar3.first,vVar3.second,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_628);
    testing::Message::~Message((Message *)0xf0f4f4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0f58b);
  local_62c = 3;
  while( true ) {
    vVar4.second = in_stack_fffffffffffff87c;
    vVar4.first = in_stack_fffffffffffff880;
    if (2000 < local_62c) break;
    vVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)vVar3.first,vVar3.second);
    local_640 = vVar4.second;
    in_stack_fffffffffffff890 = vVar4.first;
    local_648 = in_stack_fffffffffffff890;
    local_638 = in_stack_fffffffffffff890;
    local_630 = local_640;
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff900,(value_type *)this_00);
    local_62c = local_62c + 1;
  }
  local_674 = 2000;
  while( true ) {
    if (local_674 < 3) break;
    vVar4 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)vVar3.first,vVar3.second);
    local_690 = vVar4;
    local_680 = vVar4;
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff900,(value_type *)this_00);
    local_674 = local_674 + -1;
  }
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)vVar4.first,
                       (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(vVar4.second,in_stack_fffffffffffff878));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)vVar4.first,
             (bool *)CONCAT44(vVar4.second,CONCAT13(bVar1,(int3)in_stack_fffffffffffff878)),
             (type *)0xf0f725);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6c8);
  if (!bVar1) {
    testing::Message::Message((Message *)vVar2.first);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_00,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)vVar2.first,vVar2.second,(char *)vVar3.first,vVar3.second,
               (char *)in_stack_fffffffffffff890);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff900,(Message *)this_00);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)vVar4.first);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff900);
    testing::Message::~Message((Message *)0xf0f7e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0f87c);
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0f889);
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::~Alloc(local_398);
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0f8a3);
  google::
  HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0f8b0);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}